

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

size_t __thiscall
OpenMesh::
PropertyT<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
::restore(PropertyT<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>
          *this,istream *_istr,bool _swap)

{
  bool bVar1;
  istream *piVar2;
  size_t sVar3;
  HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>
  *in_RSI;
  long *in_RDI;
  size_t i;
  size_t bytes;
  vector<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>,_std::allocator<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>_>
  *in_stack_ffffffffffffffb8;
  HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>
  *_v;
  istream *in_stack_ffffffffffffffc0;
  istream *_is;
  istream *local_30;
  size_t local_28;
  size_t local_8;
  
  bVar1 = IO::
          is_streamable<std::vector<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::ITraits,OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::Refs>,std::allocator<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::ITraits,OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::Refs>>>>
                    ();
  if (bVar1) {
    local_8 = IO::
              restore<std::vector<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::ITraits,OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::Refs>,std::allocator<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::ITraits,OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::Refs>>>>
                        (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,false);
  }
  else {
    local_28 = 0;
    local_30 = (istream *)0x0;
    while( true ) {
      _is = local_30;
      piVar2 = (istream *)(**(code **)(*in_RDI + 0x58))();
      if (piVar2 <= _is) break;
      _v = in_RSI;
      std::
      vector<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>,_std::allocator<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>_>
      ::operator[]((vector<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>,_std::allocator<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::ITraits,_OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>::Refs>_>_>
                    *)(in_RDI + 6),(size_type)local_30);
      sVar3 = IO::
              restore<OpenMesh::DefaultTraits::HalfedgeT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::ITraits,OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,false>::Refs>>
                        (_is,_v,false);
      local_28 = sVar3 + local_28;
      local_30 = local_30 + 1;
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

virtual size_t restore( std::istream& _istr, bool _swap )
  {
    if ( IO::is_streamable<vector_type>() )
      return IO::restore(_istr, data_, _swap );
    size_t bytes = 0;
    for (size_t i=0; i<n_elements(); ++i)
      bytes += IO::restore( _istr, data_[i], _swap );
    return bytes;
  }